

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupLevelized(Gia_Man_t *p)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  int *__ptr;
  void *__ptr_00;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pGVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  
  iVar4 = Gia_ManLevelNum(p);
  __ptr = (int *)calloc((long)(int)(iVar4 + 1U),4);
  iVar12 = p->nObjs;
  __ptr_00 = malloc((long)(~(p->vCos->nSize + p->vCis->nSize) + iVar12) << 2);
  if (0 < iVar12) {
    lVar13 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar5 = *(uint *)(p->pObjs + lVar13);
      if (-1 < (int)uVar5 && (~uVar5 & 0x1fffffff) != 0) {
        pVVar8 = p->vLevels;
        Vec_IntFillExtra(pVVar8,(int)lVar13 + 1,0);
        if (pVVar8->nSize <= lVar13) goto LAB_00686fa7;
        __ptr[pVVar8->pArray[lVar13]] = __ptr[pVVar8->pArray[lVar13]] + 1;
        iVar12 = p->nObjs;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar12);
  }
  if (0 < iVar4) {
    iVar10 = *__ptr;
    uVar11 = 1;
    do {
      iVar10 = iVar10 + __ptr[uVar11];
      __ptr[uVar11] = iVar10;
      uVar11 = uVar11 + 1;
    } while (iVar4 + 1U != uVar11);
  }
  if (0 < iVar12) {
    lVar13 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar5 = *(uint *)(p->pObjs + lVar13);
      if (-1 < (int)uVar5 && (~uVar5 & 0x1fffffff) != 0) {
        pVVar8 = p->vLevels;
        Vec_IntFillExtra(pVVar8,(int)lVar13 + 1,0);
        if (pVVar8->nSize <= lVar13) {
LAB_00686fa7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar12 = __ptr[(long)pVVar8->pArray[lVar13] + -1];
        __ptr[(long)pVVar8->pArray[lVar13] + -1] = iVar12 + 1;
        *(int *)((long)__ptr_00 + (long)iVar12 * 4) = (int)lVar13;
        iVar12 = p->nObjs;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar12);
  }
  p_00 = Gia_ManStart(iVar12);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pName = pcVar7;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  pVVar8 = p->vCis;
  uVar5 = pVVar8->nSize;
  uVar11 = (ulong)uVar5;
  if (0 < (int)uVar5) {
    lVar13 = 0;
    do {
      uVar5 = (uint)uVar11;
      iVar12 = pVVar8->pArray[lVar13];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_00686f4a;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar11 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) {
LAB_00686f69:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) goto LAB_00686f69;
      pGVar2[iVar12].Value = (int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
      pVVar8 = p->vCis;
      uVar5 = pVVar8->nSize;
      uVar11 = (ulong)(int)uVar5;
    } while (lVar13 < (long)uVar11);
  }
  iVar12 = p->nObjs;
  pVVar8 = p->vCos;
  iVar4 = pVVar8->nSize;
  if ((int)((uVar5 + iVar4) - iVar12) < -1) {
    lVar13 = 0;
    do {
      iVar10 = *(int *)((long)__ptr_00 + lVar13 * 4);
      if (((long)iVar10 < 0) || (iVar12 <= iVar10)) goto LAB_00686f4a;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar10;
      uVar11 = *(ulong *)pGVar2;
      if ((int)pGVar2[-(ulong)((uint)uVar11 & 0x1fffffff)].Value < 0) goto LAB_00686f88;
      uVar5 = (uint)(uVar11 >> 0x20);
      if ((int)pGVar2[-(ulong)(uVar5 & 0x1fffffff)].Value < 0) goto LAB_00686f88;
      uVar5 = Gia_ManAppendAnd(p_00,(uint)(uVar11 >> 0x1d) & 1 ^
                                    pGVar2[-(ulong)((uint)uVar11 & 0x1fffffff)].Value,
                               pGVar2[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1);
      pGVar2->Value = uVar5;
      lVar13 = lVar13 + 1;
      iVar12 = p->nObjs;
      pVVar8 = p->vCos;
      iVar4 = pVVar8->nSize;
    } while (lVar13 < ~(p->vCis->nSize + iVar4) + iVar12);
  }
  if (0 < iVar4) {
    lVar13 = 0;
    do {
      iVar12 = pVVar8->pArray[lVar13];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) {
LAB_00686f4a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar12;
      if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0) {
LAB_00686f88:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      uVar5 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                   pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value)
      ;
      pGVar2->Value = uVar5;
      lVar13 = lVar13 + 1;
      pVVar8 = p->vCos;
    } while (lVar13 < pVVar8->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupLevelized( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nLevels = Gia_ManLevelNum( p );
    int * pCounts = ABC_CALLOC( int, nLevels + 1 );
    int * pNodes = ABC_ALLOC( int, Gia_ManAndNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
        pCounts[Gia_ObjLevel(p, pObj)]++;
    for ( i = 1; i <= nLevels; i++ )
        pCounts[i] += pCounts[i-1];
    Gia_ManForEachAnd( p, pObj, i )
        pNodes[pCounts[Gia_ObjLevel(p, pObj)-1]++] = i;
    // duplicate
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    for ( i = 0; i < Gia_ManAndNum(p) && (pObj = Gia_ManObj(p, pNodes[i])); i++ )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    ABC_FREE( pCounts );
    ABC_FREE( pNodes );
    return pNew;
}